

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O3

int __thiscall OpenMD::StringTokenizer::countTokens(StringTokenizer *this)

{
  char *pcVar1;
  long lVar2;
  int iVar3;
  char cVar4;
  char *pcVar5;
  
  pcVar5 = (this->currentPos_)._M_current;
  if ((this->end_)._M_current == pcVar5) {
    iVar3 = 0;
  }
  else {
    cVar4 = (char)this + ' ';
    iVar3 = 0;
LAB_001f4d83:
    do {
      lVar2 = std::__cxx11::string::find(cVar4,(ulong)(uint)(int)*pcVar5);
      pcVar1 = (this->end_)._M_current;
      if (lVar2 != -1) {
        pcVar5 = pcVar5 + 1;
        iVar3 = iVar3 + (uint)this->returnTokens_;
        if (pcVar5 != pcVar1) goto LAB_001f4d83;
      }
      if (pcVar5 == pcVar1) {
        return iVar3;
      }
      do {
        lVar2 = std::__cxx11::string::find(cVar4,(ulong)(uint)(int)*pcVar5);
        if (lVar2 != -1) break;
        pcVar5 = pcVar5 + 1;
      } while (pcVar5 != (this->end_)._M_current);
      iVar3 = iVar3 + 1;
    } while (pcVar5 != (this->end_)._M_current);
  }
  return iVar3;
}

Assistant:

int StringTokenizer::countTokens() {
    std::string::const_iterator tmpIter = currentPos_;
    int numToken                        = 0;

    while (true) {
      // skip delimiter first
      while (tmpIter != end_ && isDelimiter(*tmpIter)) {
        ++tmpIter;

        if (returnTokens_) {
          // if delimiter is consider as token
          ++numToken;
        }
      }

      if (tmpIter == end_) { break; }

      // encount a token here
      while (tmpIter != end_ && !isDelimiter(*tmpIter)) {
        ++tmpIter;
      }

      ++numToken;
    }

    return numToken;
  }